

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O2

void m2v_mult_col_from(m2v *M,int c,int offs,int alpha)

{
  byte bVar1;
  int r;
  
  if (alpha == 0) {
    bVar1 = (byte)c & 0x1f;
    for (; offs < M->n_row; offs = offs + 1) {
      M->e[M->row_stride * offs + c / 0x20] =
           M->e[M->row_stride * offs + c / 0x20] & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    }
  }
  return;
}

Assistant:

void m2v_mult_col_from(m2v* M, int c, int offs, int alpha)
{
	assert(0 <= c && c < M->n_col);
	assert(0 <= offs && offs <= M->n_row);

	if (alpha != 0)
		return;
	m2v_base m = ~get_mask(get_bit(M, c));
	for (int r = offs; r < M->n_row; ++r) {
		M->e[get_word(M, r, c)] &= m;
	}
}